

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref.cpp
# Opt level: O2

MPP_RET mpp_enc_ref_cfg_check(MppEncRefCfg ref)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  MPP_RET MVar6;
  int iVar7;
  MPP_RET MVar8;
  MPP_RET MVar9;
  MPP_RET MVar10;
  MPP_RET MVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int *piVar19;
  int iVar20;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  MppEncRefs refs;
  
  MVar6 = _check_is_mpp_enc_ref_cfg("mpp_enc_ref_cfg_check",ref);
  if (MVar6 != MPP_OK) {
    return MPP_ERR_VALUE;
  }
  uVar12 = *(uint *)((long)ref + 0x1c);
  uVar1 = *(uint *)((long)ref + 0x20);
  local_68 = 0;
  local_64 = 0;
  local_60 = 0;
  if (uVar12 != 0) {
    uVar18 = 0;
    uVar17 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar17 = uVar18;
    }
    piVar19 = (int *)(*(long *)((long)ref + 0x28) + 0x14);
    bVar5 = true;
    local_68 = 0;
    uVar12 = 0;
    local_64 = 0;
    local_60 = 0;
    for (; (int)uVar17 != (int)uVar18; uVar18 = (ulong)((int)uVar18 + 1)) {
      uVar13 = piVar19[-3];
      iVar7 = piVar19[-5];
      iVar20 = piVar19[-4];
      uVar14 = 1 << ((byte)iVar7 & 0x1f);
      if (0xf < iVar7) {
        bVar5 = false;
        _mpp_log_l(2,"mpp_enc_ref",
                   "ref cfg %p lt cfg %d with invalid lt_idx %d larger than MPP_ENC_MAX_LT_REF_NUM\n"
                   ,"mpp_enc_ref_cfg_check",ref,uVar18,iVar7);
      }
      uVar16 = uVar14;
      if ((uVar14 & uVar12) != 0) {
        _mpp_log_l(2,"mpp_enc_ref","ref cfg %p lt cfg %d with redefined lt_idx %d config\n",
                   "mpp_enc_ref_cfg_check",ref,uVar18,iVar7);
        uVar16 = 0;
        bVar5 = false;
      }
      local_60 = local_60 + (uint)((uVar14 & uVar12) == 0);
      if (local_64 < iVar7) {
        local_64 = iVar7;
      }
      if (iVar20 != 0) {
        bVar5 = false;
        _mpp_log_l(2,"mpp_enc_ref","ref cfg %p lt cfg %d with invalid temporal_id %d is non-zero\n",
                   "mpp_enc_ref_cfg_check",ref,uVar18,iVar20);
      }
      if ((0x19 < uVar13) || ((0x200007fU >> (uVar13 & 0x1f) & 1) == 0)) {
        _mpp_log_l(2,"mpp_enc_ref","ref cfg %p lt cfg %d with invalid ref mode %x\n",
                   "mpp_enc_ref_cfg_check",ref,uVar18,uVar13);
        goto LAB_001252d5;
      }
      if (!bVar5) goto LAB_001252d5;
      if ((piVar19[-1] != 0) && (iVar7 = piVar19[-1] + *piVar19, local_68 < iVar7)) {
        local_68 = iVar7;
      }
      uVar12 = uVar12 | uVar16;
      piVar19 = piVar19 + 6;
    }
  }
  local_5c = 0;
  if (uVar1 == 0) {
    iVar20 = -1;
    iVar7 = 0;
  }
  else {
    uVar12 = 0;
    if (0 < (int)uVar1) {
      uVar12 = uVar1;
    }
    piVar19 = (int *)(*(long *)((long)ref + 0x30) + 0x10);
    bVar5 = true;
    iVar20 = 0;
    uVar13 = 0;
    iVar7 = 0;
    local_5c = 0;
    for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
      iVar2 = piVar19[-3];
      uVar16 = piVar19[-2];
      bVar3 = (byte)iVar2 & 0x1f;
      uVar15 = 1 << bVar3;
      if (3 < iVar2) {
        bVar5 = false;
        _mpp_log_l(2,"mpp_enc_ref",
                   "ref cfg %p st cfg %d with invalid temporal_id %d larger than MPP_ENC_MAX_TEMPORAL_LAYER_NUM\n"
                   ,"mpp_enc_ref_cfg_check",ref,(ulong)uVar14,iVar2);
      }
      if ((0x1d < uVar16) || ((0x2000007fU >> (uVar16 & 0x1f) & 1) == 0)) {
        bVar5 = false;
        _mpp_log_l(2,"mpp_enc_ref","ref cfg %p st cfg %d with invalid ref mode %x\n",
                   "mpp_enc_ref_cfg_check",ref,(ulong)uVar14,uVar16);
      }
      if (*piVar19 < 0) {
        _mpp_log_l(2,"mpp_enc_ref","ref cfg %p st cfg %d with negative repeat %d set to zero\n",
                   "mpp_enc_ref_cfg_check",ref,(ulong)uVar14,*piVar19);
        *piVar19 = 0;
      }
      if (uVar1 - 1 == uVar14 || uVar14 == 0) {
        if (piVar19[-4] != 0) {
          bVar5 = false;
          _mpp_log_l(2,"mpp_enc_ref",
                     "ref cfg %p st cfg %d with invalid non-ref frame on head/tail frame\n",
                     "mpp_enc_ref_cfg_check",ref,(ulong)uVar14);
        }
        if (0 < iVar2) {
          _mpp_log_l(2,"mpp_enc_ref",
                     "ref cfg %p st cfg %d with invalid non-zero temporal id %d on head/tail frame\n"
                     ,"mpp_enc_ref_cfg_check",ref,(ulong)uVar14,iVar2);
          break;
        }
      }
      if (!bVar5) break;
      bVar4 = (uVar15 & uVar13) == 0;
      if (!bVar4 || piVar19[-4] != 0) {
        uVar15 = 0 << bVar3;
      }
      uVar13 = uVar13 | uVar15;
      local_5c = local_5c + (uint)(bVar4 && piVar19[-4] == 0);
      if (iVar7 < iVar2) {
        iVar7 = iVar2;
      }
      iVar20 = iVar20 + *piVar19 + 1;
      piVar19 = piVar19 + 5;
    }
    if ((int)uVar14 < (int)uVar1) {
LAB_001252d5:
      uVar12 = 0;
      _mpp_log_l(2,"mpp_enc_ref","check ref cfg %p failed\n","mpp_enc_ref_cfg_check",ref);
      goto LAB_00125395;
    }
    iVar20 = iVar20 + -1;
  }
  refs = (MppEncRefs)0x0;
  *(undefined4 *)((long)ref + 0x38) = 0;
  *(int *)((long)ref + 0x3c) = local_60;
  *(int *)((long)ref + 0x40) = local_5c;
  *(int *)((long)ref + 0x44) = local_64;
  *(int *)((long)ref + 0x48) = iVar7;
  *(int *)((long)ref + 0x4c) = local_68;
  *(int *)((long)ref + 0x50) = iVar20;
  MVar6 = mpp_enc_refs_init(&refs);
  MVar8 = mpp_enc_refs_set_cfg(refs,ref);
  MVar9 = mpp_enc_refs_dryrun(refs);
  MVar10 = mpp_enc_refs_get_cpb_info(refs,(MppEncCpbInfo *)((long)ref + 0x38));
  MVar11 = mpp_enc_refs_deinit(&refs);
  uVar12 = (uint)(((MVar9 == MPP_OK && MVar8 == MPP_OK) && (MVar11 == MPP_OK && MVar10 == MPP_OK))
                 && MVar6 == MPP_OK);
LAB_00125395:
  *(uint *)((long)ref + 8) = uVar12;
  return uVar12 + MPP_NOK;
}

Assistant:

MPP_RET mpp_enc_ref_cfg_check(MppEncRefCfg ref)
{
    if (check_is_mpp_enc_ref_cfg(ref))
        return MPP_ERR_VALUE;

    MppEncRefCfgImpl *p = (MppEncRefCfgImpl *)ref;
    RK_S32 lt_cfg_cnt = p->lt_cfg_cnt;
    RK_S32 st_cfg_cnt = p->st_cfg_cnt;
    RK_S32 max_lt_ref_cnt   = 0;
    RK_S32 max_lt_ref_idx   = 0;
    RK_S32 lt_idx_used_mask = 0;
    RK_S32 lt_dryrun_length = 0;
    RK_S32 max_st_ref_cnt   = 0;
    RK_S32 max_st_tid       = 0;
    RK_S32 st_tid_used_mask = 0;
    RK_S32 st_dryrun_length = 0;
    RK_S32 ready = 1;

    /* parse and check gop config for encoder */
    if (lt_cfg_cnt) {
        RK_S32 pos = 0;
        MppEncRefLtFrmCfg *cfg = p->lt_cfg;

        for (pos = 0; pos < lt_cfg_cnt; pos++, cfg++) {
            MppEncRefMode ref_mode = cfg->ref_mode;
            RK_S32 temporal_id = cfg->temporal_id;
            RK_S32 lt_idx = cfg->lt_idx;
            RK_U32 lt_idx_mask = 1 << lt_idx;

            /* check lt idx */
            if (lt_idx >= MPP_ENC_MAX_LT_REF_NUM) {
                mpp_err_f("ref cfg %p lt cfg %d with invalid lt_idx %d larger than MPP_ENC_MAX_LT_REF_NUM\n",
                          ref, pos, lt_idx);
                ready = 0;
            }

            if (lt_idx_used_mask & lt_idx_mask) {
                mpp_err_f("ref cfg %p lt cfg %d with redefined lt_idx %d config\n",
                          ref, pos, lt_idx);
                ready = 0;
            }

            if (!(lt_idx_used_mask & lt_idx_mask)) {
                lt_idx_used_mask |= lt_idx_mask;
                max_lt_ref_cnt++;
            }

            if (lt_idx > max_lt_ref_idx)
                max_lt_ref_idx = lt_idx;

            /* check temporal id */
            if (temporal_id != 0) {
                mpp_err_f("ref cfg %p lt cfg %d with invalid temporal_id %d is non-zero\n",
                          ref, pos, temporal_id);
                ready = 0;
            }

            /* check gop mode */
            if (!REF_MODE_IS_GLOBAL(ref_mode) && !REF_MODE_IS_LT_MODE(ref_mode)) {
                mpp_err_f("ref cfg %p lt cfg %d with invalid ref mode %x\n",
                          ref, pos, ref_mode);
                ready = 0;
            }

            /* if check failed just quit */
            if (!ready)
                break;

            if (cfg->lt_gap && (cfg->lt_gap + cfg->lt_delay > lt_dryrun_length))
                lt_dryrun_length = cfg->lt_gap + cfg->lt_delay;
        }
    }

    /* check st-ref config */
    if (ready && st_cfg_cnt) {
        RK_S32 pos = 0;
        MppEncRefStFrmCfg *cfg = p->st_cfg;

        for (pos = 0; pos < st_cfg_cnt; pos++, cfg++) {
            MppEncRefMode ref_mode = cfg->ref_mode;
            RK_S32 temporal_id = cfg->temporal_id;
            RK_U32 tid_mask = 1 << temporal_id;

            /* check temporal_id */
            if (temporal_id > MPP_ENC_MAX_TEMPORAL_LAYER_NUM - 1) {
                mpp_err_f("ref cfg %p st cfg %d with invalid temporal_id %d larger than MPP_ENC_MAX_TEMPORAL_LAYER_NUM\n",
                          ref, pos, temporal_id);
                ready = 0;
            }

            /* check gop mode */
            if (!REF_MODE_IS_GLOBAL(ref_mode) && !REF_MODE_IS_ST_MODE(ref_mode)) {
                mpp_err_f("ref cfg %p st cfg %d with invalid ref mode %x\n",
                          ref, pos, ref_mode);
                ready = 0;
            }

            if (cfg->repeat < 0) {
                mpp_err_f("ref cfg %p st cfg %d with negative repeat %d set to zero\n",
                          ref, pos, cfg->repeat);
                cfg->repeat = 0;
            }

            /* constrain on head and tail frame */
            if (pos == 0 || (pos == st_cfg_cnt - 1)) {
                if (cfg->is_non_ref) {
                    mpp_err_f("ref cfg %p st cfg %d with invalid non-ref frame on head/tail frame\n",
                              ref, pos);
                    ready = 0;
                }

                if (temporal_id > 0) {
                    mpp_err_f("ref cfg %p st cfg %d with invalid non-zero temporal id %d on head/tail frame\n",
                              ref, pos, temporal_id);
                    ready = 0;
                }
            }

            if (!ready)
                break;

            if (!cfg->is_non_ref && !(st_tid_used_mask & tid_mask)) {
                max_st_ref_cnt++;
                st_tid_used_mask |= tid_mask;
            }

            if (temporal_id > max_st_tid)
                max_st_tid = temporal_id;

            st_dryrun_length++;
            st_dryrun_length += cfg->repeat;
        }
    }

    if (ready) {
        MppEncCpbInfo *cpb_info = &p->cpb_info;
        MppEncRefs refs = NULL;
        MPP_RET ret = MPP_OK;

        cpb_info->dpb_size = 0;
        cpb_info->max_lt_cnt = max_lt_ref_cnt;
        cpb_info->max_st_cnt = max_st_ref_cnt;
        cpb_info->max_lt_idx = max_lt_ref_idx;
        cpb_info->max_st_tid = max_st_tid;
        cpb_info->lt_gop     = lt_dryrun_length;
        cpb_info->st_gop     = st_dryrun_length - 1;

        ret = mpp_enc_refs_init(&refs);
        ready = (ret) ? 0 : (ready);
        ret = mpp_enc_refs_set_cfg(refs, ref);
        ready = (ret) ? 0 : (ready);
        ret = mpp_enc_refs_dryrun(refs);
        ready = (ret) ? 0 : (ready);

        /* update dpb size */
        ret = mpp_enc_refs_get_cpb_info(refs, cpb_info);
        ready = (ret) ? 0 : (ready);

        ret = mpp_enc_refs_deinit(&refs);
        ready = (ret) ? 0 : (ready);
    } else {
        mpp_err_f("check ref cfg %p failed\n", ref);
    }
    p->ready = ready;

    return ready ? MPP_OK : MPP_NOK;
}